

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O3

bool __thiscall
glcts::ViewportArray::DepthRangeAPI::iterateHelper<double>(DepthRangeAPI *this,double *param_1)

{
  undefined4 *puVar1;
  GLdouble GVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  bool test_result;
  GLint max_viewports;
  DepthFuncWrapper depthFunc;
  vector<double,_std::allocator<double>_> depth_range_data_b;
  vector<double,_std::allocator<double>_> depth_range_data_a;
  bool local_75;
  int local_74;
  DepthFuncWrapper local_70;
  vector<double,_std::allocator<double>_> local_68;
  long local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  iVar5 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar5);
  iVar5 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_70.m_gl = (Functions *)CONCAT44(extraout_var_00,iVar5);
  local_75 = true;
  local_74 = 0;
  (**(code **)(lVar9 + 0x868))(0x825b,&local_74);
  local_50 = lVar9;
  dVar6 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar6,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,0x881);
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (GLdouble *)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (GLdouble *)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize(&local_48,(ulong)(uint)(local_74 * 2));
  std::vector<double,_std::allocator<double>_>::resize(&local_68,(ulong)(uint)(local_74 * 2));
  getDepthRanges<double>(this,&local_70,local_74,&local_48);
  if (0 < (long)local_74) {
    lVar9 = 0;
    do {
      dVar3 = ((double *)
              ((long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar9))[1];
      *(double *)
       ((long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar9) =
           *(double *)
            ((long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar9) + 0.125;
      ((double *)
      ((long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + lVar9))[1] = dVar3 + -0.125;
      lVar9 = lVar9 + 0x10;
    } while ((long)local_74 << 4 != lVar9);
  }
  (*(local_70.m_gl)->depthRangeArrayv)
            (0,local_74,
             local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar6 = (**(code **)(local_50 + 0x800))();
  glu::checkError(dVar6,"depthRangeArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,0x897);
  getDepthRanges<double>(this,&local_70,local_74,&local_68);
  compareDepthRanges<double>(this,&local_48,&local_68,"depthRangeArray",&local_75);
  if (0 < local_74) {
    lVar11 = 0;
    lVar9 = 0;
    do {
      *(undefined8 *)
       ((long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar11) = 0x3fd0000000000000;
      ((undefined8 *)
      ((long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + lVar11))[1] = 0x3fe8000000000000;
      (*(local_70.m_gl)->depthRangeIndexed)((GLuint)lVar9,0.25,0.75);
      dVar6 = (**(code **)(local_50 + 0x800))();
      glu::checkError(dVar6,"depthRangeIndexed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0x8a7);
      getDepthRanges<double>(this,&local_70,local_74,&local_48);
      compareDepthRanges<double>(this,&local_48,&local_68,"depthRangeIndexed",&local_75);
      lVar9 = lVar9 + 1;
      lVar11 = lVar11 + 0x10;
    } while (lVar9 < local_74);
  }
  iVar5 = -1;
  uVar10 = 3;
  lVar9 = 0;
  uVar12 = 0;
  while( true ) {
    if ((long)local_74 <= (long)uVar12) break;
    GVar2 = *(GLdouble *)(&DAT_01b8dc00 + (ulong)((uVar12 & 1) == 0) * 8);
    if (uVar12 != 0) {
      lVar11 = 0;
      do {
        *(GLdouble *)
         ((long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar11) = GVar2;
        *(GLdouble *)
         ((long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar11 + 8) = GVar2;
        lVar11 = lVar11 + 0x10;
      } while (lVar9 != lVar11);
    }
    uVar12 = uVar12 + 1;
    if ((int)uVar12 < local_74) {
      iVar7 = local_74 + iVar5;
      uVar8 = uVar10;
      do {
        local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar8 - 1] = GVar2;
        local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar8] = GVar2;
        uVar8 = uVar8 + 2;
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
    }
    (*(local_70.m_gl)->depthRangeArrayv)
              (0,local_74,
               local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start);
    dVar6 = (**(code **)(local_50 + 0x800))();
    glu::checkError(dVar6,"depthRangeArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x8c3);
    getDepthRanges<double>(this,&local_70,local_74,&local_48);
    lVar9 = lVar9 + 0x10;
    iVar5 = iVar5 + -1;
    uVar10 = uVar10 + 2;
    compareDepthRanges<double>(this,&local_48,&local_68,"depthRangeArray",&local_75);
  }
  if (0 < local_74) {
    lVar9 = 0;
    do {
      puVar1 = (undefined4 *)
               ((long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar9);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1[2] = 0;
      puVar1[3] = 0x3ff00000;
      lVar9 = lVar9 + 0x10;
    } while ((long)local_74 * 0x10 != lVar9);
  }
  (*(local_70.m_gl)->depthRange)(0.0,1.0);
  dVar6 = (**(code **)(local_50 + 0x800))();
  glu::checkError(dVar6,"depthRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,0x8d4);
  getDepthRanges<double>(this,&local_70,local_74,&local_68);
  compareDepthRanges<double>(this,&local_48,&local_68,"depthRange",&local_75);
  bVar4 = local_75;
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (GLdouble *)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (GLdouble *)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool DepthRangeAPI::iterateHelper(T*)
{
	/* GL entry points */
	const glw::Functions&   gl = m_context.getRenderContext().getFunctions();
	Utils::DepthFuncWrapper depthFunc(m_context);

	bool test_result = true;

	GLint max_viewports = 0;

	gl.getIntegerv(GL_MAX_VIEWPORTS, &max_viewports);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	std::vector<T> depth_range_data_a;
	std::vector<T> depth_range_data_b;

	depth_range_data_a.resize(max_viewports * m_n_elements);
	depth_range_data_b.resize(max_viewports * m_n_elements);

	/*
	 *   - get initial values of DEPTH_RANGE for all MAX_VIEWPORTS indices;
	 *   - change values of all indices at once with DepthRangeArrayv;
	 *   - get DEPTH_RANGE for all MAX_VIEWPORTS indices and verify results;
	 */
	getDepthRanges(depthFunc, max_viewports, depth_range_data_a);

	for (GLint i = 0; i < max_viewports; ++i)
	{
		depth_range_data_a[i * m_n_elements + 0] += 0.125;
		depth_range_data_a[i * m_n_elements + 1] -= 0.125;
	}

	depthFunc.depthRangeArray(0, max_viewports, &depth_range_data_a[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "depthRangeArray");

	getDepthRanges(depthFunc, max_viewports, depth_range_data_b);
	compareDepthRanges(depth_range_data_a, depth_range_data_b, "depthRangeArray", test_result);

	/*
	 *   - for each index:
	 *     * modify with DepthRangeIndexed,
	 *     * get DEPTH_RANGE for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		depth_range_data_b[i * m_n_elements + 0] = 0.25;
		depth_range_data_b[i * m_n_elements + 1] = 0.75;

		depthFunc.depthRangeIndexed(i, (T)0.25, (T)0.75);
		GLU_EXPECT_NO_ERROR(gl.getError(), "depthRangeIndexed");

		getDepthRanges(depthFunc, max_viewports, depth_range_data_a);
		compareDepthRanges(depth_range_data_a, depth_range_data_b, "depthRangeIndexed", test_result);
	}

	/*
	 *   - for each index:
	 *     * modify all indices before and after current one with DepthRangeArrayv,
	 *     * get DEPTH_RANGE for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		const T value = (0 == i % 2) ? T(1.0) : T(0.25);

		for (GLint j = 0; j < i; ++j)
		{
			depth_range_data_b[j * m_n_elements + 0] = value;
			depth_range_data_b[j * m_n_elements + 1] = value;
		}

		for (GLint j = i + 1; j < max_viewports; ++j)
		{
			depth_range_data_b[j * m_n_elements + 0] = value;
			depth_range_data_b[j * m_n_elements + 1] = value;
		}

		depthFunc.depthRangeArray(0, max_viewports, &depth_range_data_b[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "depthRangeArray");

		getDepthRanges(depthFunc, max_viewports, depth_range_data_a);
		compareDepthRanges(depth_range_data_a, depth_range_data_b, "depthRangeArray", test_result);
	}

	/*
	 *   - change values of all indices at once with DepthRange;
	 *   - get DEPTH_RANGE for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		depth_range_data_a[i * m_n_elements + 0] = 0.0f;
		depth_range_data_a[i * m_n_elements + 1] = 1.0f;
	}

	depthFunc.depthRange((T)0.0, (T)1.0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "depthRange");

	getDepthRanges(depthFunc, max_viewports, depth_range_data_b);
	compareDepthRanges(depth_range_data_a, depth_range_data_b, "depthRange", test_result);

	return test_result;
}